

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::Transpose<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,1,_1,false>>>
               (Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *lhs,
               Transpose<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>_>
               *rhs,Transpose<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                    *dest,Scalar *alpha)

{
  Index *this;
  long lVar1;
  ScalarWithConstIfNotLvalue *res;
  Index rows;
  TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *pTVar2;
  Index cols;
  EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *this_00;
  float *ptr;
  size_t size;
  ulong uVar3;
  Index IVar4;
  Index resIncr;
  ScalarWithConstIfNotLvalue **ppSVar5;
  Scalar SVar6;
  float alpha_00;
  ScalarWithConstIfNotLvalue *local_278;
  Index local_270;
  Index local_268;
  TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *local_260;
  Index local_258;
  Scalar *local_250;
  EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *local_248;
  float *local_240;
  size_t local_238;
  float *local_230;
  Scalar *local_228;
  Scalar *local_220;
  Scalar *local_218;
  Scalar *local_210;
  Scalar *local_208;
  Scalar *local_200;
  float local_1f4;
  EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>_>_>
  *local_1f0;
  float local_1e4;
  float local_1e0;
  Scalar local_1dc;
  BlockImpl_dense<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>,__1,_1,_true,_true>
  local_1d8;
  const_blas_data_mapper<float,_long,_0> local_170;
  const_blas_data_mapper<float,_long,_1> local_160;
  undefined1 local_150 [8];
  aligned_stack_memory_handler<float> actualRhsPtr_stack_memory_destructor;
  RhsScalar *actualRhsPtr;
  gemv_static_vector_if<float,__1,__1,_false> static_rhs;
  EigenBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>_>_>
  local_118 [4];
  ResScalar actualAlpha;
  undefined1 local_e8 [8];
  type actualRhs;
  type actualLhs;
  Scalar *alpha_local;
  Transpose<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_> *dest_local;
  Transpose<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>_>
  *rhs_local;
  Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *lhs_local;
  
  ppSVar5 = &local_278;
  actualRhs.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)blas_traits<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>::
              extract(lhs);
  local_1f0 = local_118;
  blas_traits<Eigen::Transpose<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_1,_-1,_true>_>_>
  ::extract((ExtractType *)local_1f0,rhs);
  Matrix<float,-1,1,0,-1,1>::
  Matrix<Eigen::Transpose<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>const>>
            ((Matrix<float,_1,1,0,_1,1> *)local_e8,local_1f0);
  local_1e4 = *alpha;
  SVar6 = blas_traits<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>::
          extractScalarFactor(lhs);
  local_1e0 = local_1e4 * SVar6;
  local_1dc = blas_traits<Eigen::Transpose<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_1,_-1,_true>_>_>
              ::extractScalarFactor(rhs);
  alpha_00 = local_1e0 * local_1dc;
  local_1f4 = alpha_00;
  uVar3 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_e8);
  if (0x3fffffffffffffff < uVar3) {
    throw_std_bad_alloc();
  }
  local_200 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                        ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_e8);
  if (local_200 == (Scalar *)0x0) {
    IVar4 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_e8);
    if ((ulong)(IVar4 * 4) < 0x20001) {
      IVar4 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_e8);
      lVar1 = -(IVar4 * 4 + 0x1eU & 0xfffffffffffffff0);
      ppSVar5 = (ScalarWithConstIfNotLvalue **)((long)&local_278 + lVar1);
      local_218 = (Scalar *)((long)&local_270 + lVar1);
    }
    else {
      IVar4 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_e8);
      local_220 = (Scalar *)aligned_malloc(IVar4 << 2);
      local_218 = local_220;
    }
    local_210 = local_218;
  }
  else {
    local_210 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                          ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_e8);
    ppSVar5 = &local_278;
    local_208 = local_210;
  }
  actualRhsPtr_stack_memory_destructor._16_8_ = local_210;
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21a883;
  local_228 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                        ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_e8);
  if (local_228 == (Scalar *)0x0) {
    local_230 = (float *)actualRhsPtr_stack_memory_destructor._16_8_;
  }
  else {
    local_230 = (float *)0x0;
  }
  local_240 = local_230;
  local_248 = (EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_e8;
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21a8d5;
  local_238 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_e8);
  this_00 = local_248;
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21a8e8;
  IVar4 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size(this_00);
  size = local_238;
  ptr = local_240;
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21a912;
  aligned_stack_memory_handler<float>::aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_150,ptr,size,0x20000 < (ulong)(IVar4 << 2)
            );
  this = &actualRhs.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_260 = (TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense> *)this;
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21a927;
  local_268 = Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)this);
  pTVar2 = local_260;
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21a93a;
  local_258 = Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)pTVar2);
  pTVar2 = local_260;
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21a94d;
  local_250 = TransposeImpl<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::data
                        (pTVar2);
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21a962;
  local_270 = TransposeImpl<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Dense>::
              outerStride((TransposeImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Dense>
                           *)&actualRhs.
                              super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows);
  local_160.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_data = local_250;
  local_170.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_data =
       (float *)actualRhsPtr_stack_memory_destructor._16_8_;
  local_170.super_blas_data_mapper<const_float,_long,_0,_0,_1>.m_stride = 1;
  local_160.super_blas_data_mapper<const_float,_long,_1,_0,_1>.m_stride = local_270;
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21aa84;
  local_278 = TransposeImpl<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_Eigen::Dense>
              ::data((TransposeImpl<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Dense>
                      *)dest);
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21aaa4;
  DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
  ::col((ColXpr *)&local_1d8,
        (DenseBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
         *)dest,0);
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21aab2;
  resIncr = BlockImpl_dense<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_-1,_1,_true,_true>
            ::innerStride(&local_1d8);
  cols = local_258;
  rows = local_268;
  res = local_278;
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21aae5;
  general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
  ::run(rows,cols,&local_160,&local_170,res,resIncr,alpha_00);
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21aaf3;
  aligned_stack_memory_handler<float>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<float> *)local_150);
  *(undefined8 *)((long)ppSVar5 + -8) = 0x21aaff;
  Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_e8);
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }